

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPrivateKey.cpp
# Opt level: O3

void __thiscall OSSLECPrivateKey::setFromOSSL(OSSLECPrivateKey *this,EC_KEY *inECKEY)

{
  EC_GROUP *grp;
  BIGNUM *bn;
  ByteString inEC;
  ByteString local_40;
  
  grp = EC_KEY_get0_group((EC_KEY *)inECKEY);
  if (grp != (EC_GROUP *)0x0) {
    OSSL::grp2ByteString(&local_40,(EC_GROUP *)grp);
    (**(code **)(*(long *)&this->super_ECPrivateKey + 0x50))(this,&local_40);
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  bn = EC_KEY_get0_private_key((EC_KEY *)inECKEY);
  if (bn != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_40,(BIGNUM *)bn);
    (**(code **)(*(long *)&this->super_ECPrivateKey + 0x48))(this,&local_40);
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void OSSLECPrivateKey::setFromOSSL(const EC_KEY* inECKEY)
{
	const EC_GROUP* grp = EC_KEY_get0_group(inECKEY);
	if (grp != NULL)
	{
		ByteString inEC = OSSL::grp2ByteString(grp);
		setEC(inEC);
	}
	const BIGNUM* pk = EC_KEY_get0_private_key(inECKEY);
	if (pk != NULL)
	{
		ByteString inD = OSSL::bn2ByteString(pk);
		setD(inD);
	}
}